

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsFree(ARKodeMem ark_mem)

{
  void *__ptr;
  
  if ((ark_mem != (ARKodeMem)0x0) &&
     (__ptr = (*ark_mem->step_getlinmem)(ark_mem), __ptr != (void *)0x0)) {
    if (*(long *)((long)__ptr + 0x50) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)__ptr + 0x50) = 0;
    }
    if (*(long *)((long)__ptr + 0x58) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)__ptr + 0x58) = 0;
    }
    if (*(long *)((long)__ptr + 0x48) != 0) {
      SUNMatDestroy();
      *(undefined8 *)((long)__ptr + 0x48) = 0;
    }
    *(undefined8 *)((long)__ptr + 0x40) = 0;
    *(undefined8 *)((long)__ptr + 0x60) = 0;
    *(undefined8 *)((long)__ptr + 0x68) = 0;
    if (*(code **)((long)__ptr + 0xe0) != (code *)0x0) {
      (**(code **)((long)__ptr + 0xe0))(ark_mem);
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int arkLsFree(ARKodeMem ark_mem)
{
  ARKLsMem arkls_mem;
  void* ark_step_lmem;

  /* Return immediately if ARKodeMem, ARKLsMem are NULL */
  if (ark_mem == NULL) { return (ARKLS_SUCCESS); }
  ark_step_lmem = ark_mem->step_getlinmem(ark_mem);
  if (ark_step_lmem == NULL) { return (ARKLS_SUCCESS); }
  arkls_mem = (ARKLsMem)ark_step_lmem;

  /* Free N_Vector memory */
  if (arkls_mem->ytemp)
  {
    N_VDestroy(arkls_mem->ytemp);
    arkls_mem->ytemp = NULL;
  }
  if (arkls_mem->x)
  {
    N_VDestroy(arkls_mem->x);
    arkls_mem->x = NULL;
  }

  /* Free savedJ memory */
  if (arkls_mem->savedJ)
  {
    SUNMatDestroy(arkls_mem->savedJ);
    arkls_mem->savedJ = NULL;
  }

  /* Nullify other N_Vector pointers */
  arkls_mem->ycur = NULL;
  arkls_mem->fcur = NULL;

  /* Nullify other SUNMatrix pointer */
  arkls_mem->A = NULL;

  /* Free preconditioner memory (if applicable) */
  if (arkls_mem->pfree) { arkls_mem->pfree(ark_mem); }

  /* free ARKLs interface structure */
  free(arkls_mem);

  return (ARKLS_SUCCESS);
}